

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

void insertions(BamReader *br,RefVector *ref,int bpRegion,
               vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp,
               vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown,string *folderPath)

{
  pointer pSVar1;
  pointer refName;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pSVar5;
  ulong uVar6;
  pointer *ppSVar7;
  int iVar8;
  int iVar9;
  SoftCluster scUp;
  
  pSVar5 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      SoftCluster::SoftCluster(&scUp,pSVar5);
      iVar2 = getIdx(scUp.info.scPos + -0x1e,scClustersDown);
      if (iVar2 != -1) {
        refName = (scClustersDown->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(scClustersDown->
                       super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)refName >> 4) * -0x71c71c71c71c71c7
        ;
        uVar3 = (ulong)iVar2;
        iVar2 = -1;
        if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
          ppSVar7 = (pointer *)
                    ((long)&refName[uVar3].nodes.
                            super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl + 8);
          uVar6 = 0xffffffff;
          iVar8 = 0;
          do {
            iVar2 = (int)uVar6;
            iVar9 = (int)ppSVar7[-0x10] - scUp.info.scPos;
            if (0x1e < iVar9) break;
            if (-0x1f < iVar9) {
              iVar2 = (int)((ulong)((long)*ppSVar7 -
                                   (long)((_Vector_impl_data *)(ppSVar7 + -1))->_M_start) >> 3) *
                      -0x11111111 +
                      (int)((long)scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x11111111;
              if (iVar8 < iVar2) {
                uVar6 = uVar3 & 0xffffffff;
              }
              if (iVar8 <= iVar2) {
                iVar8 = iVar2;
              }
            }
            iVar2 = (int)uVar6;
            uVar3 = uVar3 + 1;
            ppSVar7 = ppSVar7 + 0x12;
          } while (uVar3 <= uVar4 && uVar4 - uVar3 != 0);
        }
        if (iVar2 != -1) {
          uVar6 = (ulong)iVar2;
          uVar3 = uVar6;
          if ((uVar4 < uVar6 || uVar4 - uVar6 == 0) ||
             (uVar3 = (ulong)scUp.info.refID,
             uVar4 = ((long)(ref->
                            super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(ref->
                            super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
             uVar4 < uVar3 || uVar4 - uVar3 == 0)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar3);
          }
          writeReads(br,ref,scUp.info.refID,(string *)refName,scUp.info.scPos,
                     refName[uVar6].info.scPos,bpRegion,folderPath);
        }
      }
      std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&scUp.nodes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scUp.info.readName._M_dataplus._M_p != &scUp.info.readName.field_2) {
        operator_delete(scUp.info.readName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scUp.info.seq._M_dataplus._M_p != &scUp.info.seq.field_2) {
        operator_delete(scUp.info.seq._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scUp.info.refName._M_dataplus._M_p != &scUp.info.refName.field_2) {
        operator_delete(scUp.info.refName._M_dataplus._M_p);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  return;
}

Assistant:

void insertions(BamTools::BamReader &br, const BamTools::RefVector &ref, const int bpRegion, const std::vector<SoftCluster> &scClustersUp, const std::vector<SoftCluster> &scClustersDown, const std::string &folderPath)
{
	for (SoftCluster scUp : scClustersUp)
	{
		int stBound = getIdx(scUp.info.scPos + MIN_INS_DIFF_CLUSTERS, scClustersDown);
		if (stBound == -1)
			continue;

		int bestIdx = -1, bestSup = 0;
		for (int i = stBound; i < scClustersDown.size(); ++i)
		{
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos > MAX_INS_DIFF_CLUSTERS)
				break;
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos < MIN_INS_DIFF_CLUSTERS)
				continue;
			int curSup = scUp.nodes.size() + scClustersDown.at(i).nodes.size();
			if (curSup > bestSup)
			{
				bestSup = curSup;
				bestIdx = i;
			}
		}
		if (bestIdx != -1)
		{
			int st = scUp.info.scPos;
			int en = scClustersDown.at(bestIdx).info.scPos;
			writeReads(br, ref, scUp.info.refID, ref.at(scUp.info.refID).RefName, st, en, bpRegion, folderPath);
		}
	}
}